

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_leaf.cpp
# Opt level: O2

void duckdb::Node15Leaf::GrowNode7Leaf(ART *art,Node *node15_leaf,Node *node7_leaf)

{
  uint8_t i;
  Node7Leaf *pNVar1;
  BaseLeaf<(unsigned_char)__x0f_,_(duckdb::NType)9> *pBVar2;
  ulong uVar3;
  byte bVar4;
  
  pNVar1 = Node::Ref<duckdb::Node7Leaf>(art,(Node)(node7_leaf->super_IndexPointer).data,NODE_7_LEAF)
  ;
  pBVar2 = BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::New(art,node15_leaf);
  Node::SetGateStatus(node15_leaf,(GateStatus)((node7_leaf->super_IndexPointer).data >> 0x3f));
  bVar4 = (pNVar1->super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>).count;
  pBVar2->count = bVar4;
  for (uVar3 = 0; uVar3 < bVar4; uVar3 = uVar3 + 1) {
    pBVar2->key[uVar3] = (pNVar1->super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>).key[uVar3];
    bVar4 = (pNVar1->super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>).count;
  }
  (pNVar1->super_BaseLeaf<(unsigned_char)__a_,_(duckdb::NType)8>).count = '\0';
  Node::Free(art,node7_leaf);
  return;
}

Assistant:

void Node15Leaf::GrowNode7Leaf(ART &art, Node &node15_leaf, Node &node7_leaf) {
	auto &n7 = Node::Ref<Node7Leaf>(art, node7_leaf, NType::NODE_7_LEAF);
	auto &n15 = New(art, node15_leaf);
	node15_leaf.SetGateStatus(node7_leaf.GetGateStatus());

	n15.count = n7.count;
	for (uint8_t i = 0; i < n7.count; i++) {
		n15.key[i] = n7.key[i];
	}

	n7.count = 0;
	Node::Free(art, node7_leaf);
}